

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

string * JSON::Writer::encode_string(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  reference pcVar5;
  char *local_88;
  uchar ch;
  allocator<char> local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_32;
  byte local_31;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  uchar c;
  const_iterator iter;
  const_iterator end;
  const_iterator begin;
  string *str_local;
  string *result;
  
  pcVar3 = (char *)std::__cxx11::string::cbegin();
  iter._M_current = (char *)std::__cxx11::string::cend();
  _Stack_30._M_current = pcVar3;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffd0,&iter);
    if (!bVar2) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
      return __return_storage_ptr__;
    }
    pbVar4 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&stack0xffffffffffffffd0);
    local_31 = *pbVar4;
    if ((((local_31 < 0x23) || (local_31 == 0x5c)) && (local_31 != 0x20)) && (local_31 != 0x21))
    break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&stack0xffffffffffffffd0);
  }
  local_32 = 0;
  local_48._M_current = _Stack_30._M_current;
  local_40._M_current = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_40,local_48,&local_49);
  std::allocator<char>::~allocator(&local_49);
  while (bVar2 = __gnu_cxx::operator!=(&stack0xffffffffffffffd0,&iter), bVar2) {
    pbVar4 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&stack0xffffffffffffffd0);
    bVar1 = *pbVar4;
    if (((bVar1 < 0x23) || (bVar1 == 0x5c)) && ((bVar1 != 0x20 && (bVar1 != 0x21)))) {
      if (bVar1 == 8) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\b");
      }
      else if (bVar1 == 9) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
      }
      else if (bVar1 == 10) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
      }
      else if (bVar1 == 0xc) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\f");
      }
      else if (bVar1 == 0xd) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
      }
      else if (bVar1 == 0x22) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\"");
      }
      else if (bVar1 == 0x5c) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
      }
      else {
        if (bVar1 < 0x10) {
          local_88 = "\\u000";
        }
        else {
          local_88 = "\\u001";
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_88);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"0123456789abcdef"[bVar1 & 0xf]);
      }
    }
    else {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&stack0xffffffffffffffd0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar5);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&stack0xffffffffffffffd0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
JSON::Writer::encode_string(std::string const& str)
{
    static auto constexpr hexchars = "0123456789abcdef";

    auto begin = str.cbegin();
    auto end = str.cend();
    auto iter = begin;
    while (iter != end) {
        auto c = static_cast<unsigned char>(*iter);
        if ((c > 34 && c != '\\') || c == ' ' || c == 33) {
            // Optimistically check that no char in str requires escaping. Hopefully we can just
            // return the input str.
            ++iter;
        } else {
            // We found a char that requires escaping. Initialize result to the chars scanned so
            // far, append/replace the rest of str one char at a time, and return the result.
            std::string result{begin, iter};

            for (; iter != end; ++iter) {
                auto ch = static_cast<unsigned char>(*iter);
                if ((ch > 34 && ch != '\\') || ch == ' ' || ch == 33) {
                    // Check for most common case first.
                    result += *iter;
                } else {
                    switch (ch) {
                    case '\\':
                        result += "\\\\";
                        break;
                    case '\"':
                        result += "\\\"";
                        break;
                    case '\b':
                        result += "\\b";
                        break;
                    case '\f':
                        result += "\\f";
                        break;
                    case '\n':
                        result += "\\n";
                        break;
                    case '\r':
                        result += "\\r";
                        break;
                    case '\t':
                        result += "\\t";
                        break;
                    default:
                        result += ch < 16 ? "\\u000" : "\\u001";
                        result += hexchars[ch % 16];
                    }
                }
            }
            return result;
        }
    }
    return str;
}